

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_result_collector.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalResultCollector::PhysicalResultCollector
          (PhysicalResultCollector *this,PreparedStatementData *data)

{
  size_t sVar1;
  idx_t iVar2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  StatementReturnType SVar6;
  pointer pPVar7;
  initializer_list<duckdb::LogicalType> __l;
  __alloc_node_gen_t __alloc_node_gen;
  allocator_type local_61;
  LogicalType local_60;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  LogicalType::LogicalType(&local_60,BOOLEAN);
  __l._M_len = 1;
  __l._M_array = &local_60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,__l,&local_61);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalOperator_02480e68;
  (this->super_PhysicalOperator).type = RESULT_COLLECTOR;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->super_PhysicalOperator).op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__align = 0;
  (this->super_PhysicalOperator).estimated_cardinality = 0;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  LogicalType::~LogicalType(&local_60);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalResultCollector_024a2628;
  this->statement_type = data->statement_type;
  local_60._0_8_ = &this->properties;
  (this->properties).read_databases._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->properties).read_databases._M_h._M_bucket_count =
       (data->properties).read_databases._M_h._M_bucket_count;
  (this->properties).read_databases._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->properties).read_databases._M_h._M_element_count =
       (data->properties).read_databases._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(data->properties).read_databases._M_h._M_rehash_policy.field_0x4;
  sVar1 = (data->properties).read_databases._M_h._M_rehash_policy._M_next_resize;
  (this->properties).read_databases._M_h._M_rehash_policy._M_max_load_factor =
       (data->properties).read_databases._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->properties).read_databases._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->properties).read_databases._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->properties).read_databases._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_60._0_8_,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)&data->properties,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_true>_>_>
              *)&local_60);
  local_60._0_8_ = &(this->properties).modified_databases;
  (this->properties).modified_databases._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->properties).modified_databases._M_h._M_bucket_count =
       (data->properties).modified_databases._M_h._M_bucket_count;
  (this->properties).modified_databases._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->properties).modified_databases._M_h._M_element_count =
       (data->properties).modified_databases._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(data->properties).modified_databases._M_h._M_rehash_policy.field_0x4;
  sVar1 = (data->properties).modified_databases._M_h._M_rehash_policy._M_next_resize;
  (this->properties).modified_databases._M_h._M_rehash_policy._M_max_load_factor =
       (data->properties).modified_databases._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->properties).modified_databases._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->properties).modified_databases._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->properties).modified_databases._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_60._0_8_,&(data->properties).modified_databases._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_true>_>_>
              *)&local_60);
  (this->properties).always_require_rebind = (data->properties).always_require_rebind;
  bVar4 = (data->properties).allow_stream_result;
  bVar5 = (data->properties).bound_all_parameters;
  SVar6 = (data->properties).return_type;
  uVar3 = *(undefined4 *)&(data->properties).field_0x74;
  iVar2 = (data->properties).parameter_count;
  (this->properties).requires_valid_transaction = (data->properties).requires_valid_transaction;
  (this->properties).allow_stream_result = bVar4;
  (this->properties).bound_all_parameters = bVar5;
  (this->properties).return_type = SVar6;
  *(undefined4 *)&(this->properties).field_0x74 = uVar3;
  (this->properties).parameter_count = iVar2;
  pPVar7 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->(&data->physical_plan);
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar7->root);
  this->plan = (pPVar7->root).ptr;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->names,
           &(data->names).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(this->super_PhysicalOperator).types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &(data->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
  ;
  return;
}

Assistant:

PhysicalResultCollector::PhysicalResultCollector(PreparedStatementData &data)
    : PhysicalOperator(PhysicalOperatorType::RESULT_COLLECTOR, {LogicalType::BOOLEAN}, 0),
      statement_type(data.statement_type), properties(data.properties), plan(data.physical_plan->Root()),
      names(data.names) {
	this->types = data.types;
}